

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_remove_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  ushort uVar1;
  uint uVar2;
  uint16_t *puVar3;
  int *c;
  int *piVar4;
  long lVar5;
  ushort uVar6;
  uint8_t uVar7;
  size_t i;
  size_t sVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint8_t new_typecode;
  uint8_t local_41;
  size_t local_40;
  uint32_t *local_38;
  
  if ((n_args != 0) && ((r->high_low_container).size != 0)) {
    uVar12 = 0xffffffff;
    sVar8 = 0;
    local_40 = n_args;
    local_38 = vals;
    do {
      uVar2 = local_38[sVar8];
      uVar6 = (ushort)(uVar2 >> 0x10);
      if (((int)uVar12 < 0) || (uVar2 >> 0x10 != (uint)(r->high_low_container).keys[uVar12])) {
        iVar10 = (r->high_low_container).size;
        if (((long)iVar10 != 0) &&
           (puVar3 = (r->high_low_container).keys, puVar3[(long)iVar10 + -1] != uVar6)) {
          if (0 < iVar10) {
            iVar10 = iVar10 + -1;
            uVar9 = 0;
            do {
              uVar11 = iVar10 + uVar9 >> 1;
              uVar12 = (ulong)uVar11;
              uVar1 = *(ushort *)((long)puVar3 + (ulong)(iVar10 + uVar9 & 0xfffffffe));
              if (uVar1 < uVar6) {
                uVar9 = uVar11 + 1;
              }
              else {
                if (uVar1 <= uVar6) goto LAB_001043ae;
                iVar10 = uVar11 - 1;
              }
            } while ((int)uVar9 <= iVar10);
            uVar9 = ~uVar9;
            goto LAB_001043a2;
          }
          goto LAB_001044ac;
        }
        uVar9 = iVar10 - 1;
LAB_001043a2:
        uVar12 = (ulong)uVar9;
        if (-1 < (int)uVar9) goto LAB_001043ae;
      }
      else {
LAB_001043ae:
        c = (int *)container_remove((r->high_low_container).containers[uVar12],(uint16_t)uVar2,
                                    (r->high_low_container).typecodes[uVar12],&local_41);
        piVar4 = (int *)(r->high_low_container).containers[uVar12];
        if (c != piVar4) {
          container_free(piVar4,(r->high_low_container).typecodes[uVar12]);
          (r->high_low_container).keys[uVar12] = uVar6;
          (r->high_low_container).containers[uVar12] = c;
          (r->high_low_container).typecodes[uVar12] = local_41;
        }
        piVar4 = c;
        uVar7 = local_41;
        if (local_41 == '\x04') {
          uVar7 = (uint8_t)c[2];
          piVar4 = *(int **)c;
        }
        iVar10 = *piVar4;
        if ((uVar7 == '\x03') || (uVar7 == '\x02')) {
          if (0 < iVar10) goto LAB_001044b2;
        }
        else if (iVar10 != 0) {
          if (iVar10 != -1) goto LAB_001044b2;
          lVar5 = 0;
          do {
            if (*(long *)(*(long *)(piVar4 + 2) + lVar5 * 8) != 0) goto LAB_001044b2;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x400);
        }
        container_free(c,local_41);
        ra_remove_at_index(&r->high_low_container,(int32_t)uVar12);
LAB_001044ac:
        uVar12 = 0xffffffff;
      }
LAB_001044b2:
      sVar8 = sVar8 + 1;
    } while (sVar8 != local_40);
  }
  return;
}

Assistant:

void roaring_bitmap_remove_many(roaring_bitmap_t *r, size_t n_args,
                                const uint32_t *vals) {
    if (n_args == 0 || r->high_low_container.size == 0) {
        return;
    }
    int32_t pos =
        -1;  // position of the container used in the previous iteration
    for (size_t i = 0; i < n_args; i++) {
        uint16_t key = (uint16_t)(vals[i] >> 16);
        if (pos < 0 || key != r->high_low_container.keys[pos]) {
            pos = ra_get_index(&r->high_low_container, key);
        }
        if (pos >= 0) {
            uint8_t new_typecode;
            container_t *new_container;
            new_container = container_remove(
                r->high_low_container.containers[pos], vals[i] & 0xffff,
                r->high_low_container.typecodes[pos], &new_typecode);
            if (new_container != r->high_low_container.containers[pos]) {
                container_free(r->high_low_container.containers[pos],
                               r->high_low_container.typecodes[pos]);
                ra_replace_key_and_container_at_index(&r->high_low_container,
                                                      pos, key, new_container,
                                                      new_typecode);
            }
            if (!container_nonzero_cardinality(new_container, new_typecode)) {
                container_free(new_container, new_typecode);
                ra_remove_at_index(&r->high_low_container, pos);
                pos = -1;
            }
        }
    }
}